

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O1

int Tas_ManSolve_rec(Tas_Man_t *p,int Level)

{
  int *piVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  int iVar8;
  Gia_Obj_t **ppGVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  int iVar12;
  uint uVar13;
  int Level_00;
  uint uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  Gia_Obj_t *pGVar19;
  bool bVar20;
  float fVar21;
  
  if ((p->pProp).iHead == (p->pProp).iTail) {
    __assert_fail("!Tas_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                  ,0x50c,"int Tas_ManSolve_rec(Tas_Man_t *, int)");
  }
  iVar7 = Tas_ManPropagate(p,Level);
  if (iVar7 != 0) {
    Tas_ManCreateCls(p,iVar7);
    return iVar7;
  }
  iVar7 = (p->pProp).iHead;
  if (iVar7 != (p->pProp).iTail) {
    __assert_fail("Tas_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                  ,0x513,"int Tas_ManSolve_rec(Tas_Man_t *, int)");
  }
  iVar3 = (p->pJust).iHead;
  iVar4 = (p->pJust).iTail;
  if (iVar3 == iVar4) {
    return 0;
  }
  iVar8 = (p->Pars).nJustThis;
  iVar12 = (p->pJust).iTail - iVar3;
  if (iVar12 < iVar8) {
    iVar12 = iVar8;
  }
  (p->Pars).nJustThis = iVar12;
  if ((p->Pars).nJustLimit < iVar12) {
    return 0;
  }
  if ((p->Pars).nBTLimit < (p->Pars).nBTThis) {
    return 0;
  }
  lVar16 = (long)iVar4;
  if (iVar3 < iVar4) {
    lVar17 = (long)iVar3;
    do {
      ppGVar9 = (p->pJust).pData;
      pGVar19 = ppGVar9[lVar17];
      iVar8 = (p->pJust).nSize;
      if ((p->pJust).iTail == iVar8) {
        (p->pJust).nSize = iVar8 * 2;
        if (ppGVar9 == (Gia_Obj_t **)0x0) {
          ppGVar9 = (Gia_Obj_t **)malloc((long)iVar8 << 4);
        }
        else {
          ppGVar9 = (Gia_Obj_t **)realloc(ppGVar9,(long)iVar8 << 4);
        }
        (p->pJust).pData = ppGVar9;
      }
      iVar8 = (p->pJust).iTail;
      (p->pJust).iTail = iVar8 + 1;
      (p->pJust).pData[iVar8] = pGVar19;
      lVar17 = lVar17 + 1;
    } while (lVar16 != lVar17);
  }
  (p->pJust).iHead = iVar4;
  if ((p->Pars).fUseActive == 0) {
    if ((p->Pars).fUseHighest == 0) {
      if ((p->Pars).fUseLowest == 0) {
        if ((p->Pars).fUseMaxFF == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                        ,0x527,"int Tas_ManSolve_rec(Tas_Man_t *, int)");
        }
        pGVar11 = Tas_ManDecideMaxFF(p);
        pGVar19 = (Gia_Obj_t *)0x0;
        goto LAB_0071ad3e;
      }
      iVar8 = (p->pJust).iTail;
      if (iVar4 < iVar8) {
        pGVar19 = (Gia_Obj_t *)0x0;
        pGVar11 = (Gia_Obj_t *)0x0;
        do {
          pGVar5 = (p->pJust).pData[lVar16];
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          pGVar10 = pGVar11;
          if (pGVar5 < pGVar11) {
            pGVar10 = pGVar5;
          }
          bVar20 = pGVar11 == (Gia_Obj_t *)0x0;
          pGVar11 = pGVar10;
          if (bVar20) {
            pGVar11 = pGVar5;
          }
          lVar16 = lVar16 + 1;
        } while (iVar8 != lVar16);
        goto LAB_0071ad3e;
      }
    }
    else {
      iVar8 = (p->pJust).iTail;
      if (iVar4 < iVar8) {
        pGVar19 = (Gia_Obj_t *)0x0;
        pGVar11 = (Gia_Obj_t *)0x0;
        do {
          pGVar5 = (p->pJust).pData[lVar16];
          if (pGVar5 == (Gia_Obj_t *)0x0) break;
          if (pGVar11 < pGVar5) {
            pGVar11 = pGVar5;
          }
          lVar16 = lVar16 + 1;
        } while (iVar8 != lVar16);
        goto LAB_0071ad3e;
      }
    }
  }
  else {
    iVar8 = (p->pJust).iTail;
    if (iVar4 < iVar8) {
      fVar21 = 0.0;
      pGVar11 = (Gia_Obj_t *)0x0;
      lVar17 = 0;
      pGVar19 = (Gia_Obj_t *)0x0;
      while (pGVar5 = (p->pJust).pData[lVar16 + lVar17], pGVar5 != (Gia_Obj_t *)0x0) {
        uVar15 = (uint)*(undefined8 *)pGVar5;
        if ((int)uVar15 < 0) {
LAB_0071af89:
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                        ,0x1d5,"Gia_Obj_t *Tas_ManFindActive(Tas_Man_t *)");
        }
        uVar15 = uVar15 & 0x1fffffff;
        if (uVar15 == 0x1fffffff) goto LAB_0071af89;
        pGVar10 = p->pAig->pObjs;
        if ((pGVar5 < pGVar10) || (pGVar10 + p->pAig->nObjs <= pGVar5)) goto LAB_0071af4b;
        iVar12 = (int)((long)pGVar5 - (long)pGVar10 >> 2) * -0x55555555;
        if (pGVar19 == (Gia_Obj_t *)0x0) {
LAB_0071ac49:
          pGVar19 = pGVar5 + -(ulong)uVar15;
          fVar21 = p->pActivity[(int)(iVar12 - uVar15)];
        }
        else {
          fVar2 = p->pActivity[(int)(iVar12 - uVar15)];
          if ((fVar21 < fVar2) ||
             (((fVar2 == fVar21 && (!NAN(fVar2) && !NAN(fVar21))) &&
              (pGVar19 < pGVar5 + -(ulong)uVar15)))) goto LAB_0071ac49;
        }
        uVar15 = (uint)((ulong)*(undefined8 *)pGVar5 >> 0x20) & 0x1fffffff;
        fVar2 = p->pActivity[(int)(iVar12 - uVar15)];
        if ((fVar21 < fVar2) ||
           (((fVar2 == fVar21 && (!NAN(fVar2) && !NAN(fVar21))) &&
            (pGVar19 < pGVar5 + -(ulong)uVar15)))) {
          pGVar19 = pGVar5 + -(ulong)uVar15;
          fVar21 = fVar2;
        }
        lVar17 = lVar17 + 1;
        if (iVar8 - iVar4 == (int)lVar17) break;
      }
      goto LAB_0071ad3e;
    }
  }
  pGVar19 = (Gia_Obj_t *)0x0;
  pGVar11 = (Gia_Obj_t *)0x0;
LAB_0071ad3e:
  if (pGVar11 != (Gia_Obj_t *)0x0) {
    uVar15 = (uint)*(undefined8 *)pGVar11;
    if ((((int)uVar15 < 0) || (uVar13 = uVar15 & 0x1fffffff, uVar13 == 0x1fffffff)) ||
       (((pGVar11[-(ulong)uVar13].field_0x3 & 0x40) != 0 ||
        (uVar14 = (uint)((ulong)*(undefined8 *)pGVar11 >> 0x20),
        (pGVar11[-(ulong)(uVar14 & 0x1fffffff)].field_0x3 & 0x40) != 0)))) {
      __assert_fail("Tas_VarIsJust( pVar )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCTas.c"
                    ,0x52b,"int Tas_ManSolve_rec(Tas_Man_t *, int)");
    }
    pGVar6 = p->pAig;
    pGVar19 = pGVar11 + -(ulong)uVar13;
    pGVar5 = pGVar6->pObjs;
    if ((((pGVar19 < pGVar5) || (pGVar5 + pGVar6->nObjs <= pGVar19)) ||
        (pGVar11 = pGVar11 + -(ulong)(uVar14 & 0x1fffffff), pGVar11 < pGVar5)) ||
       (pGVar5 + pGVar6->nObjs <= pGVar11)) {
LAB_0071af4b:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (pGVar6->pRefs[(int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * -0x55555555] <
        pGVar6->pRefs[(int)((ulong)((long)pGVar19 - (long)pGVar5) >> 2) * -0x55555555]) {
      uVar18 = (ulong)(uVar15 >> 0x1d & 1) ^ (ulong)pGVar19;
    }
    else {
      uVar18 = (ulong)(uVar14 >> 0x1d & 1) ^ (ulong)pGVar11;
    }
    pGVar19 = (Gia_Obj_t *)(uVar18 ^ 1);
  }
  Level_00 = Level + 1;
  Tas_ManAssign(p,pGVar19,Level_00,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
  iVar12 = Tas_ManSolve_rec(p,Level_00);
  iVar8 = 0;
  if ((iVar12 != 0) &&
     (iVar8 = iVar12,
     (p->pClauses).pData[iVar12] == (Gia_Obj_t *)((ulong)pGVar19 & 0xfffffffffffffffe))) {
    Tas_ManCancelUntil(p,iVar7);
    (p->pJust).iHead = iVar3;
    (p->pJust).iTail = iVar4;
    Tas_ManAssign(p,(Gia_Obj_t *)((ulong)pGVar19 ^ 1),Level_00,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
    iVar7 = Tas_ManSolve_rec(p,Level_00);
    iVar8 = 0;
    if ((iVar7 != 0) &&
       (ppGVar9 = (p->pClauses).pData, iVar8 = iVar7,
       ppGVar9[iVar7] == (Gia_Obj_t *)((ulong)pGVar19 & 0xfffffffffffffffe))) {
      iVar8 = Tas_ManResolve(p,iVar12,iVar7,(int)ppGVar9);
      Tas_ManCreateCls(p,iVar8);
      piVar1 = &(p->Pars).nBTThis;
      *piVar1 = *piVar1 + 1;
    }
  }
  return iVar8;
}

Assistant:

int Tas_ManSolve_rec( Tas_Man_t * p, int Level )
{ 
    Tas_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pVar = NULL, * pDecVar = NULL;
    int hClause, hLearn0, hLearn1;
    int iPropHead, iJustHead, iJustTail;
    // propagate assignments
    assert( !Tas_QueIsEmpty(&p->pProp) );
    if ( (hClause = Tas_ManPropagate( p, Level )) )
    {
        Tas_ManCreateCls( p, hClause );
        return hClause;
    }
    // check for satisfying assignment
    assert( Tas_QueIsEmpty(&p->pProp) );
    if ( Tas_QueIsEmpty(&p->pJust) )
        return 0;
    // quit using resource limits
    p->Pars.nJustThis = Abc_MaxInt( p->Pars.nJustThis, p->pJust.iTail - p->pJust.iHead );
    if ( Tas_ManCheckLimits( p ) )
        return 0;
    // remember the state before branching
    iPropHead = p->pProp.iHead;
    Tas_QueStore( &p->pJust, &iJustHead, &iJustTail );
    // find the decision variable
    if ( p->Pars.fUseActive )
        pVar = NULL, pDecVar = Tas_ManFindActive( p );
    else if ( p->Pars.fUseHighest )
//        pVar = NULL, pDecVar = Tas_ManDecideHighestFanin( p );
        pVar = Tas_ManDecideHighest( p );
    else if ( p->Pars.fUseLowest )
        pVar = Tas_ManDecideLowest( p );
    else if ( p->Pars.fUseMaxFF )
        pVar = Tas_ManDecideMaxFF( p );
    else assert( 0 );
    // chose decision variable using fanout count
    if ( pVar != NULL )
    {
        assert( Tas_VarIsJust( pVar ) );
        if ( Gia_ObjRefNum(p->pAig, Gia_ObjFanin0(pVar)) > Gia_ObjRefNum(p->pAig, Gia_ObjFanin1(pVar)) )
            pDecVar = Gia_Not(Gia_ObjChild0(pVar));
        else
            pDecVar = Gia_Not(Gia_ObjChild1(pVar));
//        pDecVar = Gia_NotCond( pDecVar, Gia_Regular(pDecVar)->fMark1 ^ !Gia_IsComplement(pDecVar) );
    }
    // decide on first fanin
    Tas_ManAssign( p, pDecVar, Level+1, NULL, NULL );
    if ( !(hLearn0 = Tas_ManSolve_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn0] != Gia_Regular(pDecVar) )
        return hLearn0;
    Tas_ManCancelUntil( p, iPropHead );
    Tas_QueRestore( &p->pJust, iJustHead, iJustTail );
    // decide on second fanin
    Tas_ManAssign( p, Gia_Not(pDecVar), Level+1, NULL, NULL );
    if ( !(hLearn1 = Tas_ManSolve_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn1] != Gia_Regular(pDecVar) )
        return hLearn1;
    hClause = Tas_ManResolve( p, Level, hLearn0, hLearn1 );
    Tas_ManCreateCls( p, hClause );
//    Tas_ManPrintClauseNew( p, Level, hClause );
//    if ( Level > Tas_ClauseDecLevel(p, hClause) )
//        p->Pars.nBTThisNc++;
    p->Pars.nBTThis++;
    return hClause;
}